

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O2

void __thiscall
Js::TypedArrayBase::SetObject
          (TypedArrayBase *this,RecyclableObject *source,uint32 targetLength,uint32 offset)

{
  ScriptContext *pSVar1;
  RecyclableObject *pRVar2;
  RecyclableObject *pRVar3;
  uint32 uVar4;
  int iVar5;
  uint32 i;
  uint32 uVar6;
  ulong uVar7;
  RecyclableObject *local_38;
  Var itemValue;
  
  pSVar1 = (((((this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
               super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
           super_JavascriptLibraryBase).scriptContext.ptr;
  uVar4 = GetSourceLength(this,source,targetLength,offset);
  pRVar2 = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
           undefinedValue.ptr;
  uVar7 = 0;
  while (uVar6 = (uint32)uVar7, uVar4 != uVar6) {
    iVar5 = (*(source->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x26])(source,source,uVar7,&local_38,pSVar1);
    pRVar3 = pRVar2;
    if (iVar5 == 1) {
      pRVar3 = local_38;
    }
    local_38 = pRVar3;
    (*(this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x70])
              (this,(ulong)(offset + uVar6),local_38);
    uVar7 = (ulong)(uVar6 + 1);
  }
  return;
}

Assistant:

void TypedArrayBase::SetObject(RecyclableObject* source, uint32 targetLength, uint32 offset)
    {
        ScriptContext* scriptContext = GetScriptContext();
        uint32 sourceLength = GetSourceLength(source, targetLength, offset);

        Var itemValue;
        Var undefinedValue = scriptContext->GetLibrary()->GetUndefined();
        for (uint32 i = 0; i < sourceLength; i ++)
        {
            if (!source->GetItem(source, i, &itemValue, scriptContext))
            {
                itemValue = undefinedValue;
            }
            DirectSetItem(offset + i, itemValue);
        }
    }